

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_12_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 *puVar1;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  float *output_end;
  undefined8 *local_8a0;
  undefined8 *local_888;
  int *local_880;
  float fStack_67c;
  float fStack_670;
  float fStack_664;
  float local_658;
  float fStack_63c;
  float fStack_630;
  float fStack_624;
  float local_618;
  float fStack_5fc;
  float fStack_5f0;
  float fStack_5e4;
  float local_5d8;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  
  local_8a0 = in_RDI;
  local_888 = in_R8;
  local_880 = in_RCX;
  do {
    puVar1 = (undefined8 *)(in_RDX + (long)(*local_880 * 7) * 4);
    local_5d8 = (float)*local_888;
    local_2e8 = (float)*puVar1;
    fStack_2e4 = (float)((ulong)*puVar1 >> 0x20);
    fStack_2e0 = (float)puVar1[1];
    fStack_2dc = (float)((ulong)puVar1[1] >> 0x20);
    local_308 = (float)*(undefined8 *)((long)puVar1 + 0xc);
    fStack_304 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc) >> 0x20);
    fStack_300 = (float)*(undefined8 *)((long)puVar1 + 0x14);
    fStack_2fc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x14) >> 0x20);
    fStack_5e4 = (float)((ulong)*local_888 >> 0x20);
    local_328 = (float)*(undefined8 *)((long)puVar1 + 0x1c);
    fStack_324 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x1c) >> 0x20);
    fStack_320 = (float)*(undefined8 *)((long)puVar1 + 0x24);
    fStack_31c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x24) >> 0x20);
    local_348 = (float)puVar1[5];
    fStack_344 = (float)((ulong)puVar1[5] >> 0x20);
    fStack_340 = (float)puVar1[6];
    fStack_33c = (float)((ulong)puVar1[6] >> 0x20);
    fStack_5f0 = (float)local_888[1];
    local_368 = (float)puVar1[7];
    fStack_364 = (float)((ulong)puVar1[7] >> 0x20);
    fStack_360 = (float)puVar1[8];
    fStack_35c = (float)((ulong)puVar1[8] >> 0x20);
    local_388 = (float)*(undefined8 *)((long)puVar1 + 0x44);
    fStack_384 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x44) >> 0x20);
    fStack_380 = (float)*(undefined8 *)((long)puVar1 + 0x4c);
    fStack_37c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x4c) >> 0x20);
    fStack_5fc = (float)((ulong)local_888[1] >> 0x20);
    local_3a8 = (float)*(undefined8 *)((long)puVar1 + 0x54);
    fStack_3a4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x54) >> 0x20);
    fStack_3a0 = (float)*(undefined8 *)((long)puVar1 + 0x5c);
    fStack_39c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x5c) >> 0x20);
    local_3c8 = (float)puVar1[0xc];
    fStack_3c4 = (float)((ulong)puVar1[0xc] >> 0x20);
    fStack_3c0 = (float)puVar1[0xd];
    fStack_3bc = (float)((ulong)puVar1[0xd] >> 0x20);
    local_618 = (float)local_888[2];
    local_3e8 = (float)puVar1[0xe];
    fStack_3e4 = (float)((ulong)puVar1[0xe] >> 0x20);
    fStack_3e0 = (float)puVar1[0xf];
    fStack_3dc = (float)((ulong)puVar1[0xf] >> 0x20);
    local_408 = (float)*(undefined8 *)((long)puVar1 + 0x7c);
    fStack_404 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x7c) >> 0x20);
    fStack_400 = (float)*(undefined8 *)((long)puVar1 + 0x84);
    fStack_3fc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x84) >> 0x20);
    fStack_624 = (float)((ulong)local_888[2] >> 0x20);
    local_428 = (float)*(undefined8 *)((long)puVar1 + 0x8c);
    fStack_424 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x8c) >> 0x20);
    fStack_420 = (float)*(undefined8 *)((long)puVar1 + 0x94);
    fStack_41c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x94) >> 0x20);
    local_448 = (float)puVar1[0x13];
    fStack_444 = (float)((ulong)puVar1[0x13] >> 0x20);
    fStack_440 = (float)puVar1[0x14];
    fStack_43c = (float)((ulong)puVar1[0x14] >> 0x20);
    fStack_630 = (float)local_888[3];
    local_468 = (float)puVar1[0x15];
    fStack_464 = (float)((ulong)puVar1[0x15] >> 0x20);
    fStack_460 = (float)puVar1[0x16];
    fStack_45c = (float)((ulong)puVar1[0x16] >> 0x20);
    local_488 = (float)*(undefined8 *)((long)puVar1 + 0xb4);
    fStack_484 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xb4) >> 0x20);
    fStack_480 = (float)*(undefined8 *)((long)puVar1 + 0xbc);
    fStack_47c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xbc) >> 0x20);
    fStack_63c = (float)((ulong)local_888[3] >> 0x20);
    local_4a8 = (float)*(undefined8 *)((long)puVar1 + 0xc4);
    fStack_4a4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc4) >> 0x20);
    fStack_4a0 = (float)*(undefined8 *)((long)puVar1 + 0xcc);
    fStack_49c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xcc) >> 0x20);
    local_4c8 = (float)puVar1[0x1a];
    fStack_4c4 = (float)((ulong)puVar1[0x1a] >> 0x20);
    fStack_4c0 = (float)puVar1[0x1b];
    fStack_4bc = (float)((ulong)puVar1[0x1b] >> 0x20);
    local_658 = (float)local_888[4];
    local_4e8 = (float)puVar1[0x1c];
    fStack_4e4 = (float)((ulong)puVar1[0x1c] >> 0x20);
    fStack_4e0 = (float)puVar1[0x1d];
    fStack_4dc = (float)((ulong)puVar1[0x1d] >> 0x20);
    local_508 = (float)*(undefined8 *)((long)puVar1 + 0xec);
    fStack_504 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xec) >> 0x20);
    fStack_500 = (float)*(undefined8 *)((long)puVar1 + 0xf4);
    fStack_4fc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xf4) >> 0x20);
    fStack_664 = (float)((ulong)local_888[4] >> 0x20);
    local_528 = (float)*(undefined8 *)((long)puVar1 + 0xfc);
    fStack_524 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xfc) >> 0x20);
    fStack_520 = (float)*(undefined8 *)((long)puVar1 + 0x104);
    fStack_51c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x104) >> 0x20);
    local_548 = (float)puVar1[0x21];
    fStack_544 = (float)((ulong)puVar1[0x21] >> 0x20);
    fStack_540 = (float)puVar1[0x22];
    fStack_53c = (float)((ulong)puVar1[0x22] >> 0x20);
    fStack_670 = (float)local_888[5];
    local_568 = (float)puVar1[0x23];
    fStack_564 = (float)((ulong)puVar1[0x23] >> 0x20);
    fStack_560 = (float)puVar1[0x24];
    fStack_55c = (float)((ulong)puVar1[0x24] >> 0x20);
    local_588 = (float)*(undefined8 *)((long)puVar1 + 0x124);
    fStack_584 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x124) >> 0x20);
    fStack_580 = (float)*(undefined8 *)((long)puVar1 + 300);
    fStack_57c = (float)((ulong)*(undefined8 *)((long)puVar1 + 300) >> 0x20);
    fStack_67c = (float)((ulong)local_888[5] >> 0x20);
    local_5a8 = (float)*(undefined8 *)((long)puVar1 + 0x134);
    fStack_5a4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x134) >> 0x20);
    fStack_5a0 = (float)*(undefined8 *)((long)puVar1 + 0x13c);
    fStack_59c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x13c) >> 0x20);
    local_5c8 = (float)puVar1[0x28];
    fStack_5c4 = (float)((ulong)puVar1[0x28] >> 0x20);
    fStack_5c0 = (float)puVar1[0x29];
    fStack_5bc = (float)((ulong)puVar1[0x29] >> 0x20);
    *(ulong *)((long)local_8a0 + 0xc) =
         CONCAT44(local_5d8 * fStack_304 + fStack_5f0 * fStack_384 + local_618 * fStack_404 +
                  fStack_630 * fStack_484 + local_658 * fStack_504 + fStack_670 * fStack_584 +
                  fStack_5e4 * fStack_344 + fStack_5fc * fStack_3c4 + fStack_624 * fStack_444 +
                  fStack_63c * fStack_4c4 + fStack_664 * fStack_544 + fStack_67c * fStack_5c4,
                  local_5d8 * local_308 + fStack_5f0 * local_388 + local_618 * local_408 +
                  fStack_630 * local_488 + local_658 * local_508 + fStack_670 * local_588 +
                  fStack_5e4 * local_348 + fStack_5fc * local_3c8 + fStack_624 * local_448 +
                  fStack_63c * local_4c8 + fStack_664 * local_548 + fStack_67c * local_5c8);
    *(ulong *)((long)local_8a0 + 0x14) =
         CONCAT44(local_5d8 * fStack_2fc + fStack_5f0 * fStack_37c + local_618 * fStack_3fc +
                  fStack_630 * fStack_47c + local_658 * fStack_4fc + fStack_670 * fStack_57c +
                  fStack_5e4 * fStack_33c + fStack_5fc * fStack_3bc + fStack_624 * fStack_43c +
                  fStack_63c * fStack_4bc + fStack_664 * fStack_53c + fStack_67c * fStack_5bc,
                  local_5d8 * fStack_300 + fStack_5f0 * fStack_380 + local_618 * fStack_400 +
                  fStack_630 * fStack_480 + local_658 * fStack_500 + fStack_670 * fStack_580 +
                  fStack_5e4 * fStack_340 + fStack_5fc * fStack_3c0 + fStack_624 * fStack_440 +
                  fStack_63c * fStack_4c0 + fStack_664 * fStack_540 + fStack_67c * fStack_5c0);
    *local_8a0 = CONCAT44(local_5d8 * fStack_2e4 + fStack_5f0 * fStack_364 + local_618 * fStack_3e4
                          + fStack_630 * fStack_464 + local_658 * fStack_4e4 +
                          fStack_670 * fStack_564 +
                          fStack_5e4 * fStack_324 + fStack_5fc * fStack_3a4 +
                          fStack_624 * fStack_424 + fStack_63c * fStack_4a4 +
                          fStack_664 * fStack_524 + fStack_67c * fStack_5a4,
                          local_5d8 * local_2e8 + fStack_5f0 * local_368 + local_618 * local_3e8 +
                          fStack_630 * local_468 + local_658 * local_4e8 + fStack_670 * local_568 +
                          fStack_5e4 * local_328 + fStack_5fc * local_3a8 + fStack_624 * local_428 +
                          fStack_63c * local_4a8 + fStack_664 * local_528 + fStack_67c * local_5a8);
    local_8a0[1] = CONCAT44(local_5d8 * fStack_2dc + fStack_5f0 * fStack_35c +
                            local_618 * fStack_3dc + fStack_630 * fStack_45c +
                            local_658 * fStack_4dc + fStack_670 * fStack_55c +
                            fStack_5e4 * fStack_31c + fStack_5fc * fStack_39c +
                            fStack_624 * fStack_41c + fStack_63c * fStack_49c +
                            fStack_664 * fStack_51c + fStack_67c * fStack_59c,
                            local_5d8 * fStack_2e0 + fStack_5f0 * fStack_360 +
                            local_618 * fStack_3e0 + fStack_630 * fStack_460 +
                            local_658 * fStack_4e0 + fStack_670 * fStack_560 +
                            fStack_5e4 * fStack_320 + fStack_5fc * fStack_3a0 +
                            fStack_624 * fStack_420 + fStack_63c * fStack_4a0 +
                            fStack_664 * fStack_520 + fStack_67c * fStack_5a0);
    local_888 = (undefined8 *)((long)local_888 + (long)in_R9D * 4);
    local_880 = local_880 + 2;
    local_8a0 = (undefined8 *)((long)local_8a0 + 0x1c);
  } while (local_8a0 < (undefined8 *)((long)in_RDI + (ulong)(uint)(in_ESI * 7) * 4));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_12_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__4_coeff_continue_from_4(8);
    stbir__store_output();
  } while ( output < output_end );
}